

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_deferring_queue.h
# Opt level: O2

pair<wasm::Expression_*,_wasm::Expression_*> __thiscall
wasm::UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>::pop
          (UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_> *this
          )

{
  undefined1 local_28 [8];
  pair<wasm::Expression_*,_wasm::Expression_*> ret;
  
  _local_28 = UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>::pop
                        (&this->
                          super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>
                        );
  std::__detail::
  _Insert_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::hash<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::insert((_Insert_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::hash<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            *)&this->processed,(value_type *)local_28);
  return _local_28;
}

Assistant:

T pop() {
    T ret = UniqueDeferredQueue<T>::pop();
    processed.insert(ret);
    return ret;
  }